

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O3

void test_open_address_dictionary_predicate_equality(planck_unit_test_t *tc)

{
  ion_boolean_t iVar1;
  planck_unit_result_t pVar2;
  undefined4 *key;
  ion_record_info_t record;
  ion_dictionary_t test_dictionary;
  ion_dict_cursor_t cursor;
  ion_predicate_t predicate;
  ion_dictionary_handler_t map_handler;
  ion_record_info_t local_e8;
  ion_dictionary_t local_e0;
  ion_dict_cursor_t local_c8;
  ion_predicate_t local_a0;
  ion_dictionary_handler_t local_80;
  
  key = (undefined4 *)malloc(4);
  local_e8.key_size = 4;
  local_e8.value_size = 10;
  createTestDictionary(&local_80,&local_e8,10,&local_e0,key_type_numeric_signed);
  local_c8.destroy = oadict_destroy_cursor;
  dictionary_build_predicate(&local_a0,'\0');
  *key = 1;
  local_c8.dictionary = &local_e0;
  local_c8.predicate = &local_a0;
  iVar1 = test_predicate(&local_c8,key);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\x01'),0x145,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    *key = 2;
    iVar1 = test_predicate(&local_c8,key);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(iVar1 == '\0'),0x149,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 != '\0') {
      *key = 0xffffffff;
      iVar1 = test_predicate(&local_c8,key);
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(iVar1 == '\0'),0x14d,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        free(key);
        (*(local_e0.handler)->delete_dictionary)(&local_e0);
        return;
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_dictionary_predicate_equality(
	planck_unit_test_t *tc
) {
	ion_key_t key_under_test;

	key_under_test = malloc(sizeof(int));

	int					size;
	ion_record_info_t	record;

	/* this is required for initializing the hash map and should come from the dictionary */
	record.key_size		= sizeof(int);
	record.value_size	= 10;
	size				= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t cursor;	/* create a new cursor */

	cursor.destroy = oadict_destroy_cursor;

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_equality, IONIZE(1, int));

	cursor.dictionary	= &test_dictionary;					/* register test dictionary */
	cursor.predicate	= &predicate;						/* register predicate */

	memcpy(key_under_test, &(int) { 1 }, sizeof(int));

	/* printf("key %i\n",*(int *)key_under_test); */

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_true == test_predicate(&cursor, key_under_test));

	memcpy(key_under_test, &(int) { 2 }, sizeof(int));

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_false == test_predicate(&cursor, key_under_test));

	memcpy(key_under_test, &(int) { -1 }, sizeof(int));

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_false == test_predicate(&cursor, key_under_test));

	free(key_under_test);

	/* destroy cursor for cleanup */
	/* cursor->destroy(&cursor); */
	/* and destroy the dictionary instance */
	test_dictionary.handler->delete_dictionary(&test_dictionary);
}